

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_load.c
# Opt level: O1

int Load_ARB_invalidate_subdata(void)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  
  _ptrc_glInvalidateBufferData = (_func_void_GLuint *)glXGetProcAddressARB("glInvalidateBufferData")
  ;
  bVar2 = _ptrc_glInvalidateBufferData == (_func_void_GLuint *)0x0;
  _ptrc_glInvalidateBufferSubData =
       (_func_void_GLuint_GLintptr_GLsizeiptr *)glXGetProcAddressARB("glInvalidateBufferSubData");
  uVar1 = bVar2 + 1;
  if (_ptrc_glInvalidateBufferSubData != (_func_void_GLuint_GLintptr_GLsizeiptr *)0x0) {
    uVar1 = (uint)bVar2;
  }
  _ptrc_glInvalidateFramebuffer =
       (_func_void_GLenum_GLsizei_GLenum_ptr *)glXGetProcAddressARB("glInvalidateFramebuffer");
  bVar3 = _ptrc_glInvalidateFramebuffer == (_func_void_GLenum_GLsizei_GLenum_ptr *)0x0;
  _ptrc_glInvalidateSubFramebuffer =
       (_func_void_GLenum_GLsizei_GLenum_ptr_GLint_GLint_GLsizei_GLsizei *)
       glXGetProcAddressARB("glInvalidateSubFramebuffer");
  bVar2 = _ptrc_glInvalidateSubFramebuffer ==
          (_func_void_GLenum_GLsizei_GLenum_ptr_GLint_GLint_GLsizei_GLsizei *)0x0;
  _ptrc_glInvalidateTexImage =
       (_func_void_GLuint_GLint *)glXGetProcAddressARB("glInvalidateTexImage");
  bVar4 = _ptrc_glInvalidateTexImage == (_func_void_GLuint_GLint *)0x0;
  _ptrc_glInvalidateTexSubImage =
       (_func_void_GLuint_GLint_GLint_GLint_GLint_GLsizei_GLsizei_GLsizei *)
       glXGetProcAddressARB("glInvalidateTexSubImage");
  return (uint)bVar4 + bVar3 + uVar1 + (uint)bVar2 +
         (uint)(_ptrc_glInvalidateTexSubImage ==
               (_func_void_GLuint_GLint_GLint_GLint_GLint_GLsizei_GLsizei_GLsizei *)0x0);
}

Assistant:

static int Load_ARB_invalidate_subdata(void)
{
	int numFailed = 0;
	_ptrc_glInvalidateBufferData = (void (CODEGEN_FUNCPTR *)(GLuint))IntGetProcAddress("glInvalidateBufferData");
	if(!_ptrc_glInvalidateBufferData) numFailed++;
	_ptrc_glInvalidateBufferSubData = (void (CODEGEN_FUNCPTR *)(GLuint, GLintptr, GLsizeiptr))IntGetProcAddress("glInvalidateBufferSubData");
	if(!_ptrc_glInvalidateBufferSubData) numFailed++;
	_ptrc_glInvalidateFramebuffer = (void (CODEGEN_FUNCPTR *)(GLenum, GLsizei, const GLenum *))IntGetProcAddress("glInvalidateFramebuffer");
	if(!_ptrc_glInvalidateFramebuffer) numFailed++;
	_ptrc_glInvalidateSubFramebuffer = (void (CODEGEN_FUNCPTR *)(GLenum, GLsizei, const GLenum *, GLint, GLint, GLsizei, GLsizei))IntGetProcAddress("glInvalidateSubFramebuffer");
	if(!_ptrc_glInvalidateSubFramebuffer) numFailed++;
	_ptrc_glInvalidateTexImage = (void (CODEGEN_FUNCPTR *)(GLuint, GLint))IntGetProcAddress("glInvalidateTexImage");
	if(!_ptrc_glInvalidateTexImage) numFailed++;
	_ptrc_glInvalidateTexSubImage = (void (CODEGEN_FUNCPTR *)(GLuint, GLint, GLint, GLint, GLint, GLsizei, GLsizei, GLsizei))IntGetProcAddress("glInvalidateTexSubImage");
	if(!_ptrc_glInvalidateTexSubImage) numFailed++;
	return numFailed;
}